

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v5::formatter<fmt::v5::basic_string_view<char>,char,void>::
parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
          (formatter<fmt::v5::basic_string_view<char>,char,void> *this,
          basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx)

{
  internal *this_00;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  *in_RCX;
  null_terminating_iterator<char> nVar1;
  error_handler eh;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  handler;
  error_handler local_31;
  formatter<fmt::v5::basic_string_view<char>,char,void> *local_30;
  formatter<fmt::v5::basic_string_view<char>,char,void> *local_28;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *local_20;
  undefined4 local_18;
  
  this_00 = (internal *)(ctx->format_str_).data_;
  local_18 = 0xb;
  nVar1.end_ = (char *)&local_30;
  nVar1.ptr_ = (char *)(this_00 + (ctx->format_str_).size_);
  local_30 = this;
  local_28 = this;
  local_20 = ctx;
  nVar1 = internal::
          parse_format_specs<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                    (this_00,nVar1,in_RCX);
  internal::check_string_type_spec<char,fmt::v5::internal::error_handler&>
            ((char)this[0x14],&local_31);
  return nVar1.ptr_;
}

Assistant:

FMT_CONSTEXPR typename ParseContext::iterator parse(ParseContext &ctx) {
    auto it = internal::null_terminating_iterator<Char>(ctx);
    typedef internal::dynamic_specs_handler<ParseContext> handler_type;
    auto type = internal::get_type<
      typename buffer_context<Char>::type, T>::value;
    internal::specs_checker<handler_type>
        handler(handler_type(specs_, ctx), type);
    it = parse_format_specs(it, handler);
    auto type_spec = specs_.type();
    auto eh = ctx.error_handler();
    switch (type) {
    case internal::none_type:
    case internal::named_arg_type:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case internal::int_type:
    case internal::uint_type:
    case internal::long_long_type:
    case internal::ulong_long_type:
    case internal::bool_type:
      handle_int_type_spec(
            type_spec, internal::int_type_checker<decltype(eh)>(eh));
      break;
    case internal::char_type:
      handle_char_specs(
          &specs_,
          internal::char_specs_checker<decltype(eh), decltype(type_spec)>(
              type_spec, eh));
      break;
    case internal::double_type:
    case internal::long_double_type:
      handle_float_type_spec(
            type_spec, internal::float_type_checker<decltype(eh)>(eh));
      break;
    case internal::cstring_type:
      internal::handle_cstring_type_spec(
            type_spec, internal::cstring_type_checker<decltype(eh)>(eh));
      break;
    case internal::string_type:
      internal::check_string_type_spec(type_spec, eh);
      break;
    case internal::pointer_type:
      internal::check_pointer_type_spec(type_spec, eh);
      break;
    case internal::custom_type:
      // Custom format specifiers should be checked in parse functions of
      // formatter specializations.
      break;
    }
    return pointer_from(it);
  }